

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdinput.c
# Opt level: O0

void start_input_pass(j_decompress_ptr cinfo)

{
  j_decompress_ptr cinfo_local;
  
  per_scan_setup(cinfo);
  latch_quant_tables(cinfo);
  (*cinfo->entropy->start_pass)(cinfo);
  (*cinfo->coef->start_input_pass)(cinfo);
  cinfo->inputctl->consume_input = cinfo->coef->consume_data;
  return;
}

Assistant:

METHODDEF(void)
start_input_pass (j_decompress_ptr cinfo)
{
  per_scan_setup(cinfo);
  latch_quant_tables(cinfo);
  (*cinfo->entropy->start_pass) (cinfo);
  (*cinfo->coef->start_input_pass) (cinfo);
  cinfo->inputctl->consume_input = cinfo->coef->consume_data;
}